

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O1

int zt_base_decode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  char cVar1;
  bool bVar2;
  byte *pbVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  uint buf [2];
  int local_58 [8];
  ulong *local_38;
  
  if (def == (zt_base_definition_t *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = 8 < def->igroups || (uint)def->igroups * 8 != (uint)def->obits * (uint)def->ogroups;
  }
  if (out_bytes == (size_t *)0x0) {
    return -1;
  }
  if (bVar2) {
    return -1;
  }
  if (in == (void *)0x0 || in_bytes == 0) {
    *out_bytes = 0;
    return 0;
  }
  lVar4 = in_bytes - 1;
  if (0 < lVar4) {
    lVar4 = 0;
    sVar6 = in_bytes;
    do {
      if ((uint)*(byte *)((long)in + (sVar6 - 1)) != (int)def->pad) goto LAB_001250b8;
      lVar4 = lVar4 + 1;
      sVar6 = sVar6 - 1;
    } while (1 < (long)sVar6);
    lVar4 = 0;
  }
LAB_001250b8:
  uVar7 = (ulong)def->igroups * ((in_bytes - lVar4) / (ulong)def->ogroups) +
          (in_bytes - lVar4) % (ulong)def->ogroups;
  if (out == (void **)0x0) {
    *out_bytes = uVar7;
    return 0;
  }
  pbVar3 = (byte *)*out;
  if (pbVar3 == (byte *)0x0) {
LAB_0012511d:
    if (*out_bytes == 0) {
      local_38 = out_bytes;
      pbVar3 = (byte *)zt_calloc_p(uVar7 + 1,1);
      if (pbVar3 == (byte *)0x0) {
        return -1;
      }
      *out = pbVar3;
      *local_38 = uVar7;
      out_bytes = local_38;
    }
    else {
      pbVar3 = (byte *)0x0;
    }
  }
  else {
    if (*out_bytes < uVar7) {
      *out_bytes = uVar7;
      return -2;
    }
    if (pbVar3 == (byte *)0x0) goto LAB_0012511d;
  }
  sVar6 = def->base;
  if (sVar6 == 0x10) {
    sVar6 = 0;
    uVar7 = 0;
    lVar4 = 0;
    while( true ) {
      cVar1 = def->dictionary[*(byte *)((long)in + sVar6)];
      if (cVar1 < '\0') {
        bVar2 = cVar1 != -1;
      }
      else {
        local_58[lVar4] = (int)cVar1;
        bVar2 = true;
        if (lVar4 == 1) {
          *pbVar3 = (byte)(local_58[0] << 4) | (byte)local_58[1];
          pbVar3 = pbVar3 + 1;
          uVar7 = uVar7 + 1;
          lVar4 = 0;
        }
        else {
          lVar4 = 1;
        }
      }
      if (!bVar2) break;
      sVar6 = sVar6 + 1;
      if (in_bytes == sVar6) {
        *out_bytes = uVar7;
        return 0;
      }
    }
    return -1;
  }
  if (sVar6 == 0x20) {
    sVar6 = 0;
    lVar4 = 0;
    uVar7 = 0;
    while( true ) {
      cVar1 = def->dictionary[*(byte *)((long)in + sVar6)];
      if (cVar1 < '\0') {
        bVar2 = cVar1 != -1;
      }
      else {
        local_58[lVar4] = (int)cVar1;
        lVar4 = lVar4 + 1;
        bVar2 = true;
        if (lVar4 == 8) {
          *pbVar3 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar3[1] = (byte)((uint)local_58[3] >> 4) |
                      (char)local_58[2] * '\x02' | (byte)(local_58[1] << 6);
          pbVar3[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
          pbVar3[3] = (byte)((uint)local_58[6] >> 3) |
                      (byte)(local_58[5] << 2) | (byte)(local_58[4] << 7);
          pbVar3[4] = (byte)(local_58[6] << 5) | (byte)local_58[7];
          pbVar3 = pbVar3 + 5;
          uVar7 = uVar7 + 5;
          lVar4 = 0;
        }
      }
      if (!bVar2) break;
      sVar6 = sVar6 + 1;
      if (in_bytes == sVar6) {
        iVar5 = 0;
        cVar1 = (char)local_58[2];
        iVar8 = 0;
        switch(lVar4) {
        case 0:
          break;
        default:
          iVar8 = -1;
          break;
        case 2:
          *pbVar3 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          uVar7 = uVar7 + 1;
          iVar8 = iVar5;
          break;
        case 4:
          *pbVar3 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar3[1] = (byte)((uint)local_58[3] >> 4) | cVar1 * '\x02' | (byte)(local_58[1] << 6);
          uVar7 = uVar7 + 2;
          iVar8 = iVar5;
          break;
        case 5:
          *pbVar3 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar3[1] = (byte)((uint)local_58[3] >> 4) | cVar1 * '\x02' | (byte)(local_58[1] << 6);
          pbVar3[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
          uVar7 = uVar7 + 3;
          iVar8 = iVar5;
          break;
        case 6:
          return -1;
        case 7:
          *pbVar3 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar3[1] = (byte)((uint)local_58[3] >> 4) | cVar1 * '\x02' | (byte)(local_58[1] << 6);
          pbVar3[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
          pbVar3[3] = (byte)((uint)local_58[6] >> 3) |
                      (byte)(local_58[5] << 2) | (byte)(local_58[4] << 7);
          uVar7 = uVar7 + 4;
          iVar8 = 0;
        }
        *out_bytes = uVar7;
        return iVar8;
      }
    }
    return -1;
  }
  if (sVar6 != 0x40) {
    return -1;
  }
  sVar6 = 0;
  lVar4 = 0;
  uVar7 = 0;
  do {
    cVar1 = def->dictionary[*(byte *)((long)in + sVar6)];
    if (cVar1 < '\0') {
      bVar2 = cVar1 != -1;
    }
    else {
      local_58[lVar4] = (int)cVar1;
      lVar4 = lVar4 + 1;
      bVar2 = true;
      if (lVar4 == 4) {
        *pbVar3 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
        pbVar3[1] = (byte)((uint)local_58[2] >> 2) | (byte)(local_58[1] << 4);
        pbVar3[2] = (byte)(local_58[2] << 6) | (byte)local_58[3];
        pbVar3 = pbVar3 + 3;
        uVar7 = uVar7 + 3;
        lVar4 = 0;
      }
    }
    if (!bVar2) {
      return -1;
    }
    sVar6 = sVar6 + 1;
  } while (in_bytes != sVar6);
  iVar8 = 0;
  switch(lVar4) {
  case 0:
    goto switchD_00125209_caseD_0;
  case 1:
    iVar8 = -1;
    break;
  case 2:
    *pbVar3 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
    break;
  case 3:
    *pbVar3 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
    pbVar3[1] = (byte)((uint)local_58[2] >> 2) | (byte)(local_58[1] << 4);
  }
  uVar7 = (uVar7 + lVar4) - 1;
switchD_00125209_caseD_0:
  *out_bytes = uVar7;
  return iVar8;
}

Assistant:

int
zt_base_decode(zt_base_definition_t * def, const void * in, size_t in_bytes, void ** out, size_t * out_bytes) {
    const unsigned char * inp;
    unsigned char       * outp;
    size_t                lcount = 0;
    size_t                ocount = 0;
    size_t                mod = 0;
	ssize_t               i;

    if (!_valid_dictionary_p(def)) {
        return -1;
    }

    if (!out_bytes) {
        return -1;
    }

    if (!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    inp  = (unsigned char *)in;

    /* strip any follow on pad chars */
    for (i=in_bytes-1; i > 0; i--) {
        if (inp[i] != def->pad) {
            i = in_bytes - 1 - i;
            break;
        }
    }

    lcount = (in_bytes-i) / def->ogroups; /* number of whole input groups */
    mod = ((in_bytes-i) % def->ogroups); /* partial inputs */
    ocount = (lcount * def->igroups) + mod; /* total output bytes */

    if (out == NULL) {
        *out_bytes = ocount;
        return 0;
    }

    if (*out != NULL && *out_bytes < ocount) {
        *out_bytes = ocount;
        return -2;
    }

    outp = *((unsigned char **)out);

    if ((outp == NULL && *out_bytes == 0)) {
        /* dynamically allocate the buffer */
        if (!(outp = zt_calloc(unsigned char, ocount+1))) {
            return -1;
        }

        *out = outp;
        *out_bytes = ocount;
    }

    switch(def->base) {
        case 64:
            return _decode64(def, inp, in_bytes, outp, out_bytes);
            break;
        case 32:
            return _decode32(def, inp, in_bytes, outp, out_bytes);
            break;
        case 16:
            return _decode16(def, inp, in_bytes, outp, out_bytes);
            break;
        default:
            break;
    }

    return -1;
}